

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  uint uVar1;
  cmMakefile *pcVar2;
  cmGlobalGenerator *pcVar3;
  pointer ppcVar4;
  cmLocalGenerator *this_00;
  pointer pcVar5;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_01;
  pointer pbVar6;
  char *pcVar7;
  string *psVar8;
  string *psVar9;
  ostream *poVar10;
  undefined8 uVar11;
  pointer in_path;
  undefined1 *puVar12;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  cmGeneratorExpression ge;
  undefined1 local_2e0 [16];
  string cleanfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string local_280;
  cmLocalUnixMakefileGenerator3 *local_260;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_258;
  string *local_250;
  cmListFileBacktrace local_248;
  ofstream fout;
  
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  puVar12 = &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)puVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fout,"ADDITIONAL_CLEAN_FILES","");
  pcVar7 = cmMakefile::GetProperty(pcVar2,(string *)&fout);
  if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar12) {
    operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    local_248.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_248.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_248);
    if (local_248.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_248.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    this_01 = cge;
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fout,"CMAKE_BUILD_TYPE","");
    psVar8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&fout);
    cleanfile._M_string_length = 0;
    cleanfile.field_2._M_local_buf[0] = '\0';
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    psVar8 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        this_01._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        (cmLocalGenerator *)this,psVar8,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&cleanfile);
    cmSystemTools::ExpandListArgument(psVar8,&cleanFiles,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,
                      CONCAT71(cleanfile.field_2._M_allocated_capacity._1_7_,
                               cleanfile.field_2._M_local_buf[0]) + 1);
    }
    if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)puVar12) {
      operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  if (cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    ppcVar4 = (pcVar3->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pcVar3->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppcVar4) {
      uVar11 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,0,0);
      if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar12) {
        operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
        operator_delete(cleanfile._M_dataplus._M_p,
                        CONCAT71(cleanfile.field_2._M_allocated_capacity._1_7_,
                                 cleanfile.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&cleanFiles);
      _Unwind_Resume(uVar11);
    }
    this_00 = *ppcVar4;
    psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    pcVar5 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cleanfile,pcVar5,pcVar5 + psVar9->_M_string_length);
    std::__cxx11::string::append((char *)&cleanfile);
    cmsys::SystemTools::CollapseFullPath((string *)&ge,&cleanfile);
    std::ofstream::ofstream
              (&fout,(char *)ge.Backtrace.TopEntry.
                             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,_S_out);
    uVar1 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3]);
    if ((uVar1 & 5) == 0) {
      local_250 = psVar9;
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n",
                 0x14);
      pbVar6 = cleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_260 = this;
      local_258 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
      if (cleanFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          cleanFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        in_path = cleanFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          cmsys::SystemTools::CollapseFullPath(&local_280,in_path,local_250);
          cmLocalGenerator::MaybeConvertToRelativePath((string *)&cge,this_00,psVar8,&local_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
          cmOutputConverter::EscapeForCMake(&local_280,(string *)&cge);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                               local_280._M_dataplus._M_p,local_280._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          if (cge._M_t.
              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl !=
              (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
               )&local_300) {
            operator_delete((void *)cge._M_t.
                                    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                    _M_head_impl,local_300._M_allocated_capacity + 1);
          }
          in_path = in_path + 1;
        } while (in_path != pbVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n",2);
      commands = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258;
      this = local_260;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                     "Could not create ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
      cmSystemTools::Error((string *)&cge);
      if (cge._M_t.
          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
           )&local_300) {
        operator_delete((void *)cge._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl,local_300._M_allocated_capacity + 1);
      }
    }
    puVar12 = &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = _VTT;
    *(undefined8 *)(_VTT[-3] + (long)&fout.super_basic_ostream<char,_std::char_traits<char>_>) =
         _vtable;
    std::filebuf::~filebuf
              ((filebuf *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    std::ios_base::~ios_base
              ((ios_base *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    if (ge.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_2e0) {
      operator_delete(ge.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                         *)local_2e0._0_8_)->_M_t)._M_impl.field_0x1);
    }
    if ((uVar1 & 5) == 0) {
      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)puVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&fout,"$(CMAKE_COMMAND) -P ","");
      cmLocalGenerator::MaybeConvertToRelativePath((string *)&cge,this_00,psVar8,&cleanfile);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&ge,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)&cge,SHELL);
      std::__cxx11::string::_M_append
                ((char *)&fout,
                 (ulong)ge.Backtrace.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      if (ge.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_2e0) {
        operator_delete(ge.Backtrace.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                           *)local_2e0._0_8_)->_M_t)._M_impl.field_0x1);
      }
      if (cge._M_t.
          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
           )&local_300) {
        operator_delete((void *)cge._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl,local_300._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
      if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar12) {
        operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,
                      CONCAT71(cleanfile.field_2._M_allocated_capacity._1_7_,
                               cleanfile.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  std::vector<std::string> cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (const char* prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop_value);
    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this,
                    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
      cleanFiles);
  }
  if (cleanFiles.empty()) {
    return;
  }

  cmLocalGenerator* rootLG =
    this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& binaryDir = rootLG->GetCurrentBinaryDirectory();
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinaryDir;
  cleanfile += "/CMakeFiles/cmake_directory_clean.cmake";
  // Write clean script
  {
    std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
    cmsys::ofstream fout(cleanfilePath.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfilePath);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeConvertToRelativePath(
        binaryDir, cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      rootLG->MaybeConvertToRelativePath(binaryDir, cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }
}